

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_estimateCCtxSize_usingCParams(ZSTD_compressionParameters cParams)

{
  ZSTD_compressionParameters cParams_00;
  int iVar1;
  size_t sVar2;
  ZSTD_strategy in_stack_00000020;
  size_t rowCCtxSize;
  size_t noRowCCtxSize;
  ZSTD_CCtx_params initialParams;
  size_t local_f8;
  ZSTD_CCtx_params *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff28 [20];
  size_t local_8;
  
  cParams_00._8_20_ = in_stack_ffffffffffffff28;
  cParams_00._0_8_ = in_stack_ffffffffffffff20;
  ZSTD_makeCCtxParamsFromCParams(cParams_00);
  iVar1 = ZSTD_rowMatchFinderSupported(in_stack_00000020);
  if (iVar1 == 0) {
    local_8 = ZSTD_estimateCCtxSize_usingCCtxParams(in_stack_ffffffffffffff18);
  }
  else {
    sVar2 = ZSTD_estimateCCtxSize_usingCCtxParams(in_stack_ffffffffffffff18);
    local_f8 = ZSTD_estimateCCtxSize_usingCCtxParams(in_stack_ffffffffffffff18);
    if (local_f8 < sVar2) {
      local_f8 = sVar2;
    }
    local_8 = local_f8;
  }
  return local_8;
}

Assistant:

size_t ZSTD_estimateCCtxSize_usingCParams(ZSTD_compressionParameters cParams)
{
    ZSTD_CCtx_params initialParams = ZSTD_makeCCtxParamsFromCParams(cParams);
    if (ZSTD_rowMatchFinderSupported(cParams.strategy)) {
        /* Pick bigger of not using and using row-based matchfinder for greedy and lazy strategies */
        size_t noRowCCtxSize;
        size_t rowCCtxSize;
        initialParams.useRowMatchFinder = ZSTD_ps_disable;
        noRowCCtxSize = ZSTD_estimateCCtxSize_usingCCtxParams(&initialParams);
        initialParams.useRowMatchFinder = ZSTD_ps_enable;
        rowCCtxSize = ZSTD_estimateCCtxSize_usingCCtxParams(&initialParams);
        return MAX(noRowCCtxSize, rowCCtxSize);
    } else {
        return ZSTD_estimateCCtxSize_usingCCtxParams(&initialParams);
    }
}